

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roots.hpp
# Opt level: O0

PositiveSet<double,_4UL> *
ruckig::roots::solve_quart_monic
          (PositiveSet<double,_4UL> *__return_storage_ptr__,double a,double b,double c,double d)

{
  int iVar1;
  reference pvVar2;
  int __x;
  PositiveSet<double,_4UL> *pPVar3;
  array<double,_3UL> *paVar4;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar5;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double extraout_XMM0_Qa_07;
  double extraout_XMM0_Qa_08;
  double extraout_XMM0_Qa_09;
  double extraout_XMM0_Qa_10;
  double extraout_XMM0_Qa_11;
  double sqrtD_4;
  double sqrtD_3;
  double eps;
  double sqrtD_2;
  double sqrtD_1;
  double D;
  double p2;
  double p1;
  double q2;
  double q1;
  double y;
  undefined1 local_68 [4];
  int number_zeroes;
  array<double,_3UL> x3;
  double c3;
  double b3;
  double a3;
  double sqrtD;
  double D_1;
  double d_local;
  double c_local;
  double b_local;
  double a_local;
  
  pPVar3 = __return_storage_ptr__;
  PositiveSet<double,_4UL>::PositiveSet(__return_storage_ptr__);
  iVar1 = (int)pPVar3;
  std::abs(iVar1);
  if (extraout_XMM0_Qa < 2.220446049250313e-16) {
    std::abs(iVar1);
    if (extraout_XMM0_Qa_00 < 2.220446049250313e-16) {
      pPVar3 = __return_storage_ptr__;
      PositiveSet<double,_4UL>::insert(__return_storage_ptr__,0.0);
      dVar5 = a * a + -(b * 4.0);
      std::abs((int)pPVar3);
      if (extraout_XMM0_Qa_01 < 2.220446049250313e-16) {
        PositiveSet<double,_4UL>::insert(__return_storage_ptr__,-a / 2.0);
        return __return_storage_ptr__;
      }
      if (dVar5 <= 0.0) {
        return __return_storage_ptr__;
      }
      dVar5 = sqrt(dVar5);
      PositiveSet<double,_4UL>::insert(__return_storage_ptr__,(-a - dVar5) / 2.0);
      PositiveSet<double,_4UL>::insert(__return_storage_ptr__,(-a + dVar5) / 2.0);
      return __return_storage_ptr__;
    }
    std::abs(iVar1);
    if ((extraout_XMM0_Qa_02 < 2.220446049250313e-16) &&
       (std::abs(iVar1), extraout_XMM0_Qa_03 < 2.220446049250313e-16)) {
      PositiveSet<double,_4UL>::insert(__return_storage_ptr__,0.0);
      dVar5 = cbrt(c);
      PositiveSet<double,_4UL>::insert(__return_storage_ptr__,-dVar5);
      return __return_storage_ptr__;
    }
  }
  x3._M_elems[2] = b * 4.0 * d + -a * a * d + -(c * c);
  iVar1 = solve_resolvent((array<double,_3UL> *)local_68,-b,a * c + -(d * 4.0),x3._M_elems[2]);
  paVar4 = (array<double,_3UL> *)local_68;
  pvVar2 = std::array<double,_3UL>::operator[](paVar4,0);
  __x = (int)paVar4;
  q1 = *pvVar2;
  if (iVar1 != 1) {
    paVar4 = (array<double,_3UL> *)local_68;
    std::array<double,_3UL>::operator[](paVar4,1);
    iVar1 = (int)paVar4;
    std::abs(iVar1);
    std::abs(iVar1);
    if (extraout_XMM0_Qa_05 < extraout_XMM0_Qa_04) {
      pvVar2 = std::array<double,_3UL>::operator[]((array<double,_3UL> *)local_68,1);
      q1 = *pvVar2;
    }
    paVar4 = (array<double,_3UL> *)local_68;
    std::array<double,_3UL>::operator[](paVar4,2);
    __x = (int)paVar4;
    std::abs(__x);
    std::abs(__x);
    if (extraout_XMM0_Qa_07 < extraout_XMM0_Qa_06) {
      paVar4 = (array<double,_3UL> *)local_68;
      pvVar2 = std::array<double,_3UL>::operator[](paVar4,2);
      __x = (int)paVar4;
      q1 = *pvVar2;
    }
  }
  std::abs(__x);
  if (2.220446049250313e-16 <= extraout_XMM0_Qa_08) {
    dVar5 = sqrt(q1 * q1 + -(d * 4.0));
    q2 = (q1 + dVar5) / 2.0;
    p1 = (q1 - dVar5) / 2.0;
    p2 = (a * q2 + -c) / (q2 - p1);
    D = (-a * p1 + c) / (q2 - p1);
  }
  else {
    p1 = q1 / 2.0;
    std::abs(__x);
    q2 = p1;
    if (2.220446049250313e-16 <= extraout_XMM0_Qa_09) {
      dVar5 = sqrt(a * a + -((b - q1) * 4.0));
      p2 = (a + dVar5) / 2.0;
      D = (a - dVar5) / 2.0;
    }
    else {
      D = a / 2.0;
      p2 = D;
    }
  }
  dVar5 = p2 * p2 + -(q2 * 4.0);
  std::abs(__x);
  if (3.552713678800501e-15 <= extraout_XMM0_Qa_10) {
    if (0.0 < dVar5) {
      dVar5 = sqrt(dVar5);
      PositiveSet<double,_4UL>::insert(__return_storage_ptr__,(-p2 - dVar5) / 2.0);
      pPVar3 = __return_storage_ptr__;
      PositiveSet<double,_4UL>::insert(__return_storage_ptr__,(-p2 + dVar5) / 2.0);
      __x = (int)pPVar3;
    }
  }
  else {
    pPVar3 = __return_storage_ptr__;
    PositiveSet<double,_4UL>::insert(__return_storage_ptr__,-p2 / 2.0);
    __x = (int)pPVar3;
  }
  dVar5 = D * D + -(p1 * 4.0);
  std::abs(__x);
  if (3.552713678800501e-15 <= extraout_XMM0_Qa_11) {
    if (0.0 < dVar5) {
      dVar5 = sqrt(dVar5);
      PositiveSet<double,_4UL>::insert(__return_storage_ptr__,(-D - dVar5) / 2.0);
      PositiveSet<double,_4UL>::insert(__return_storage_ptr__,(-D + dVar5) / 2.0);
    }
  }
  else {
    PositiveSet<double,_4UL>::insert(__return_storage_ptr__,-D / 2.0);
  }
  return __return_storage_ptr__;
}

Assistant:

inline PositiveSet<double, 4> solve_quart_monic(double a, double b, double c, double d) {
    PositiveSet<double, 4> roots;

    if (std::abs(d) < DBL_EPSILON) {
        if (std::abs(c) < DBL_EPSILON) {
            roots.insert(0.0);

            const double D = a * a - 4 * b;
            if (std::abs(D) < DBL_EPSILON) {
                roots.insert(-a / 2);
            } else if (D > 0.0) {
                const double sqrtD = std::sqrt(D);
                roots.insert((-a - sqrtD) / 2);
                roots.insert((-a + sqrtD) / 2);
            }
            return roots;
        }

        if (std::abs(a) < DBL_EPSILON && std::abs(b) < DBL_EPSILON) {
            roots.insert(0.0);
            roots.insert(-std::cbrt(c));
            return roots;
        }
    }

    const double a3 = -b;
    const double b3 = a * c - 4 * d;
    const double c3 = -a * a * d - c * c + 4 * b * d;

    std::array<double, 3> x3;
    const int number_zeroes = solve_resolvent(x3, a3, b3, c3);

    double y = x3[0];
    // Choosing Y with maximal absolute value.
    if (number_zeroes != 1) {
        if (std::abs(x3[1]) > std::abs(y)) {
            y = x3[1];
        }
        if (std::abs(x3[2]) > std::abs(y)) {
            y = x3[2];
        }
    }

    double q1, q2, p1, p2;

    double D = y * y - 4 * d;
    if (std::abs(D) < DBL_EPSILON) {
        q1 = q2 = y / 2;
        D = a * a - 4 * (b - y);
        if (std::abs(D) < DBL_EPSILON) {
            p1 = p2 = a / 2;
        } else {
            const double sqrtD = std::sqrt(D);
            p1 = (a + sqrtD) / 2;
            p2 = (a - sqrtD) / 2;
        }
    } else {
        const double sqrtD = std::sqrt(D);
        q1 = (y + sqrtD) / 2;
        q2 = (y - sqrtD) / 2;
        p1 = (a * q1 - c) / (q1 - q2);
        p2 = (c - a * q2) / (q1 - q2);
    }

    constexpr double eps {16 * DBL_EPSILON};

    D = p1 * p1 - 4 * q1;
    if (std::abs(D) < eps) {
        roots.insert(-p1 / 2);
    } else if (D > 0.0) {
        const double sqrtD = std::sqrt(D);
        roots.insert((-p1 - sqrtD) / 2);
        roots.insert((-p1 + sqrtD) / 2);
    }

    D = p2 * p2 - 4 * q2;
    if (std::abs(D) < eps) {
        roots.insert(-p2 / 2);
    } else if (D > 0.0) {
        const double sqrtD = std::sqrt(D);
        roots.insert((-p2 - sqrtD) / 2);
        roots.insert((-p2 + sqrtD) / 2);
    }

    return roots;
}